

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O2

FT_Error afm_parser_parse(AFM_Parser parser)

{
  FT_Memory memory;
  AFM_FontInfo pAVar1;
  AFM_Stream pAVar2;
  AFM_FontInfo pAVar3;
  int iVar4;
  AFM_Token AVar5;
  FT_Error FVar6;
  FT_Error FVar7;
  FT_Int FVar8;
  char *pcVar9;
  ulong uVar10;
  AFM_KernPair pAVar11;
  ulong uVar12;
  AFM_TrackKern pAVar13;
  uint uVar14;
  FT_Offset *in_RDX;
  FT_Offset *extraout_RDX;
  FT_Offset *extraout_RDX_00;
  FT_Offset *extraout_RDX_01;
  FT_Offset *extraout_RDX_02;
  FT_Offset *extraout_RDX_03;
  FT_Offset *extraout_RDX_04;
  FT_Offset *extraout_RDX_05;
  FT_Offset *extraout_RDX_06;
  FT_Offset *extraout_RDX_07;
  FT_Offset *extraout_RDX_08;
  FT_Offset *extraout_RDX_09;
  FT_Offset *pFVar15;
  FT_Offset *extraout_RDX_10;
  FT_Offset *extraout_RDX_11;
  FT_Offset *extraout_RDX_12;
  FT_Offset *extraout_RDX_13;
  FT_Offset *extraout_RDX_14;
  FT_Offset *extraout_RDX_15;
  int local_f8;
  uint local_f4;
  AFM_FontInfo local_f0;
  FT_Int n;
  undefined4 uStack_e4;
  uint local_e0;
  FT_Int metrics_sets;
  FT_Offset len;
  FT_Offset local_d0;
  FT_Offset len_1;
  anon_union_8_5_814e15a7_for_u local_c0;
  int local_b8;
  FT_UInt local_b0;
  undefined4 uStack_ac;
  int local_a8;
  uint local_a0;
  undefined4 uStack_9c;
  int local_98;
  uint local_90;
  undefined4 uStack_8c;
  int local_88;
  FT_Fixed local_80;
  AFM_ValueRec shared_vals [4];
  
  memory = parser->memory;
  pAVar1 = parser->FontInfo;
  metrics_sets = 0;
  if (pAVar1 == (AFM_FontInfo)0x0) {
    FVar7 = 6;
  }
  else {
    pcVar9 = afm_parser_next_key(parser,(FT_Bool)&len,in_RDX);
    FVar7 = 2;
    if (((pcVar9 != (char *)0x0) && (len == 0x10)) &&
       (iVar4 = strncmp(pcVar9,"StartFontMetrics",0x10), iVar4 == 0)) {
      FVar7 = 0xa0;
      pFVar15 = extraout_RDX;
      do {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  pcVar9 = afm_parser_next_key(parser,(FT_Bool)&len,pFVar15);
                  if (pcVar9 == (char *)0x0) goto LAB_001f3aec;
                  AVar5 = afm_tokenize(pcVar9,len);
                  if (AVar5 != AFM_TOKEN_ASCENDER) break;
                  shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
                  FVar8 = afm_parser_read_vals(parser,shared_vals,1);
                  if (FVar8 != 1) goto LAB_001f3aec;
                  pAVar1->Ascender = CONCAT71(shared_vals[0].u.f._1_7_,shared_vals[0].u.b);
                  pFVar15 = extraout_RDX_06;
                }
                if (AVar5 != AFM_TOKEN_DESCENDER) break;
                shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
                FVar8 = afm_parser_read_vals(parser,shared_vals,1);
                if (FVar8 != 1) goto LAB_001f3aec;
                pAVar1->Descender = CONCAT71(shared_vals[0].u.f._1_7_,shared_vals[0].u.b);
                pFVar15 = extraout_RDX_02;
              }
              if (AVar5 != AFM_TOKEN_FONTBBOX) break;
              shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
              shared_vals[1].type = shared_vals[0].type;
              shared_vals[2].type = shared_vals[0].type;
              shared_vals[3].type = shared_vals[0].type;
              FVar8 = afm_parser_read_vals(parser,shared_vals,4);
              if (FVar8 != 4) goto LAB_001f3aec;
              (pAVar1->FontBBox).xMin = CONCAT71(shared_vals[0].u.f._1_7_,shared_vals[0].u.b);
              (pAVar1->FontBBox).yMin = (FT_Pos)shared_vals[1].u;
              (pAVar1->FontBBox).xMax = (FT_Pos)shared_vals[2].u;
              (pAVar1->FontBBox).yMax = (FT_Pos)shared_vals[3].u;
              pFVar15 = extraout_RDX_08;
            }
            if (AVar5 != AFM_TOKEN_ISCIDFONT) break;
            shared_vals[0].type = AFM_VALUE_TYPE_BOOL;
            FVar8 = afm_parser_read_vals(parser,shared_vals,1);
            if (FVar8 != 1) goto LAB_001f3aec;
            pAVar1->IsCIDFont = shared_vals[0].u.b;
            pFVar15 = extraout_RDX_01;
          }
          if (AVar5 == AFM_TOKEN_METRICSSETS) break;
          if (AVar5 == AFM_TOKEN_STARTCHARMETRICS) {
            n = 0;
            FVar6 = afm_parser_read_int(parser,&n);
            if (FVar6 != 0) goto LAB_001f3aec;
            iVar4 = n + 1;
            pFVar15 = extraout_RDX_03;
            while (iVar4 = iVar4 + -1, 0 < iVar4) {
              pcVar9 = afm_parser_next_key(parser,'\0',pFVar15);
              pFVar15 = extraout_RDX_04;
              if (pcVar9 == (char *)0x0) {
                return 0xa0;
              }
            }
            do {
              pcVar9 = afm_parser_next_key(parser,(FT_Bool)&len_1,pFVar15);
              if (pcVar9 == (char *)0x0) {
                return 0xa0;
              }
              AVar5 = afm_tokenize(pcVar9,CONCAT44(len_1._4_4_,(int)len_1));
            } while ((AVar5 != AFM_TOKEN_ENDCHARMETRICS) &&
                    (pFVar15 = extraout_RDX_05, AVar5 != AFM_TOKEN_ENDFONTMETRICS));
            FVar7 = 0;
            pFVar15 = extraout_RDX_05;
          }
          else {
            if (AVar5 == AFM_TOKEN_ENDFONTMETRICS) {
              return 0;
            }
            pFVar15 = extraout_RDX_00;
            if (AVar5 == AFM_TOKEN_STARTKERNDATA) {
              local_f0 = (AFM_FontInfo)0x0;
              uVar10 = CONCAT71((int7)((ulong)&len >> 8),1);
              goto LAB_001f3783;
            }
          }
        }
        FVar6 = afm_parser_read_int(parser,&metrics_sets);
        if (FVar6 != 0) goto LAB_001f3aec;
        pFVar15 = extraout_RDX_07;
      } while ((metrics_sets & 0xfffffffdU) == 0);
      FVar7 = 7;
LAB_001f3aec:
      ft_mem_free(memory,pAVar1->TrackKerns);
      pAVar1->TrackKerns = (AFM_TrackKern)0x0;
      pAVar1->NumTrackKern = 0;
      ft_mem_free(memory,pAVar1->KernPairs);
      pAVar1->KernPairs = (AFM_KernPair)0x0;
      pAVar1->NumKernPair = 0;
      pAVar1->IsCIDFont = '\0';
    }
  }
  return FVar7;
LAB_001f3783:
  pcVar9 = afm_parser_next_key(parser,(FT_Bool)&local_d0,pFVar15);
  FVar7 = 0xa0;
  if (pcVar9 == (char *)0x0) goto LAB_001f3aec;
  AVar5 = afm_tokenize(pcVar9,local_d0);
  pFVar15 = extraout_RDX_09;
  if (AVar5 != AFM_TOKEN_UNKNOWN) {
    if (AVar5 - AFM_TOKEN_ENDFONTMETRICS < 2) {
      return 0;
    }
    if (AVar5 - AFM_TOKEN_STARTKERNPAIRS < 2) {
      local_e0 = (uint)uVar10;
      if ((int)local_f0 != 0) goto LAB_001f3aec;
      pAVar2 = parser->stream;
      pAVar3 = parser->FontInfo;
      FVar7 = afm_parser_read_int(parser,(FT_Int *)&local_f4);
      if ((FVar7 == 0) && (-1 < (int)local_f4)) {
        pAVar3->NumKernPair = local_f4;
        uVar10 = (long)pAVar2->limit - (long)pAVar2->cursor;
        pFVar15 = (FT_Offset *)(uVar10 % 10);
        local_f0 = pAVar3;
        if ((ulong)local_f4 <= uVar10 / 10) {
          if (local_f4 != 0) {
            pAVar11 = (AFM_KernPair)
                      ft_mem_qrealloc(parser->memory,0x10,0,(ulong)local_f4,(void *)0x0,
                                      (FT_Error *)&len_1);
            local_f0->KernPairs = pAVar11;
            pFVar15 = extraout_RDX_10;
            FVar7 = (int)len_1;
            if ((int)len_1 != 0) goto LAB_001f3aec;
          }
          local_f8 = -1;
          uVar10 = (ulong)local_e0;
          while( true ) {
            do {
              pcVar9 = afm_parser_next_key(parser,(FT_Bool)&n,pFVar15);
              if (pcVar9 == (char *)0x0) goto LAB_001f3ae6;
              AVar5 = afm_tokenize(pcVar9,CONCAT44(uStack_e4,n));
              uVar12 = (ulong)(AVar5 - AFM_TOKEN_ENDFONTMETRICS);
              if (0x37 < AVar5 - AFM_TOKEN_ENDFONTMETRICS) goto LAB_001f3ae6;
              pFVar15 = extraout_RDX_11;
            } while (uVar12 == 0x37);
            if ((7UL >> (uVar12 & 0x3f) & 1) != 0) break;
            if (((0x34000UL >> (uVar12 & 0x3f) & 1) == 0) ||
               (local_f8 = local_f8 + 1, (int)local_f0->NumKernPair <= local_f8)) goto LAB_001f3ae6;
            pAVar11 = local_f0->KernPairs + local_f8;
            len_1._0_4_ = 5;
            local_a8 = 3;
            local_b8 = (int)len_1;
            local_98 = local_a8;
            FVar8 = afm_parser_read_vals(parser,(AFM_Value)&len_1,4);
            if (FVar8 < 3) goto LAB_001f3ae6;
            pAVar11->index1 = local_c0.i;
            pAVar11->index2 = local_b0;
            pFVar15 = (FT_Offset *)0x0;
            uVar10 = (ulong)local_e0;
            uVar14 = local_a0;
            if (AVar5 != AFM_TOKEN_KPY) {
              uVar14 = 0;
              if (FVar8 == 4 && AVar5 == AFM_TOKEN_KP) {
                uVar14 = local_90;
              }
              pFVar15 = (FT_Offset *)(ulong)local_a0;
            }
            pAVar11->x = (FT_Int)pFVar15;
            pAVar11->y = uVar14;
          }
          uVar14 = local_f8 + 1;
          if (uVar14 != local_f0->NumKernPair) {
            local_f0->NumKernPair = uVar14;
          }
          qsort(local_f0->KernPairs,(ulong)uVar14,0x10,afm_compare_kern_pairs);
          local_f0 = (AFM_FontInfo)0x1;
          pFVar15 = extraout_RDX_12;
          goto LAB_001f3783;
        }
      }
    }
    else {
      if ((AVar5 != AFM_TOKEN_STARTTRACKKERN) || ((uVar10 & 1) == 0)) goto LAB_001f3aec;
      pAVar2 = parser->stream;
      pAVar3 = parser->FontInfo;
      FVar7 = afm_parser_read_int(parser,(FT_Int *)&local_f4);
      if ((FVar7 == 0) && (-1 < (int)local_f4)) {
        pAVar3->NumTrackKern = local_f4;
        uVar10 = (long)pAVar2->limit - (long)pAVar2->cursor;
        pFVar15 = (FT_Offset *)(uVar10 % 0x14);
        if ((ulong)local_f4 <= uVar10 / 0x14) {
          if (local_f4 != 0) {
            pAVar13 = (AFM_TrackKern)
                      ft_mem_qrealloc(parser->memory,0x28,0,(ulong)local_f4,(void *)0x0,
                                      (FT_Error *)&len_1);
            pAVar3->TrackKerns = pAVar13;
            pFVar15 = extraout_RDX_13;
            FVar7 = (int)len_1;
            if ((int)len_1 != 0) goto LAB_001f3aec;
          }
          iVar4 = -1;
          do {
            while( true ) {
              pcVar9 = afm_parser_next_key(parser,(FT_Bool)&n,pFVar15);
              if (pcVar9 == (char *)0x0) goto LAB_001f3ae6;
              AVar5 = afm_tokenize(pcVar9,CONCAT44(uStack_e4,n));
              if (AVar5 != AFM_TOKEN_TRACKKERN) break;
              iVar4 = iVar4 + 1;
              if ((int)pAVar3->NumTrackKern <= iVar4) goto LAB_001f3ae6;
              pAVar13 = pAVar3->TrackKerns;
              len_1._0_4_ = 3;
              local_b8 = 2;
              local_a8 = local_b8;
              local_98 = local_b8;
              local_88 = local_b8;
              FVar8 = afm_parser_read_vals(parser,(AFM_Value)&len_1,5);
              if (FVar8 != 5) goto LAB_001f3ae6;
              pAVar13[iVar4].degree = local_c0.i;
              pAVar13[iVar4].min_ptsize = CONCAT44(uStack_ac,local_b0);
              pAVar13[iVar4].min_kern = CONCAT44(uStack_9c,local_a0);
              pAVar13[iVar4].max_ptsize = CONCAT44(uStack_8c,local_90);
              pAVar13[iVar4].max_kern = local_80;
              pFVar15 = extraout_RDX_15;
            }
            pFVar15 = extraout_RDX_14;
          } while (AVar5 == AFM_TOKEN_UNKNOWN);
          if ((AVar5 - AFM_TOKEN_ENDFONTMETRICS < 2) || (AVar5 == AFM_TOKEN_ENDTRACKKERN)) {
            if (iVar4 + 1U != pAVar3->NumTrackKern) {
              pAVar3->NumTrackKern = iVar4 + 1U;
            }
            uVar10 = 0;
            goto LAB_001f3783;
          }
        }
      }
    }
LAB_001f3ae6:
    FVar7 = 0xa0;
    goto LAB_001f3aec;
  }
  goto LAB_001f3783;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  afm_parser_parse( AFM_Parser  parser )
  {
    FT_Memory     memory = parser->memory;
    AFM_FontInfo  fi     = parser->FontInfo;
    FT_Error      error  = FT_ERR( Syntax_Error );
    char*         key;
    FT_Offset     len;
    FT_Int        metrics_sets = 0;


    if ( !fi )
      return FT_THROW( Invalid_Argument );

    key = afm_parser_next_key( parser, 1, &len );
    if ( !key || len != 16                              ||
         ft_strncmp( key, "StartFontMetrics", 16 ) != 0 )
      return FT_THROW( Unknown_File_Format );

    while ( ( key = afm_parser_next_key( parser, 1, &len ) ) != 0 )
    {
      AFM_ValueRec  shared_vals[4];


      switch ( afm_tokenize( key, len ) )
      {
      case AFM_TOKEN_METRICSSETS:
        if ( afm_parser_read_int( parser, &metrics_sets ) )
          goto Fail;

        if ( metrics_sets != 0 && metrics_sets != 2 )
        {
          error = FT_THROW( Unimplemented_Feature );

          goto Fail;
        }
        break;

      case AFM_TOKEN_ISCIDFONT:
        shared_vals[0].type = AFM_VALUE_TYPE_BOOL;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->IsCIDFont = shared_vals[0].u.b;
        break;

      case AFM_TOKEN_FONTBBOX:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[1].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[2].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[3].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 4 ) != 4 )
          goto Fail;

        fi->FontBBox.xMin = shared_vals[0].u.f;
        fi->FontBBox.yMin = shared_vals[1].u.f;
        fi->FontBBox.xMax = shared_vals[2].u.f;
        fi->FontBBox.yMax = shared_vals[3].u.f;
        break;

      case AFM_TOKEN_ASCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Ascender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_DESCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Descender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_STARTCHARMETRICS:
        {
          FT_Int  n = 0;


          if ( afm_parser_read_int( parser, &n ) )
            goto Fail;

          error = afm_parser_skip_section( parser, n,
                                           AFM_TOKEN_ENDCHARMETRICS );
          if ( error )
            return error;
        }
        break;

      case AFM_TOKEN_STARTKERNDATA:
        error = afm_parse_kern_data( parser );
        if ( error )
          goto Fail;
        /* we only support kern data, so ... */
        FALL_THROUGH;

      case AFM_TOKEN_ENDFONTMETRICS:
        return FT_Err_Ok;

      default:
        break;
      }
    }

  Fail:
    FT_FREE( fi->TrackKerns );
    fi->NumTrackKern = 0;

    FT_FREE( fi->KernPairs );
    fi->NumKernPair = 0;

    fi->IsCIDFont = 0;

    return error;
  }